

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O3

string * __thiscall
t_lua_generator::render_const_value_abi_cxx11_
          (string *__return_storage_ptr__,t_lua_generator *this,t_type *type,t_const_value *value)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _func_int *p_Var3;
  long lVar4;
  size_t __n;
  pointer pcVar5;
  _Alloc_hider _Var6;
  int iVar7;
  t_const_value_type tVar8;
  uint uVar9;
  t_type *ptVar10;
  undefined4 extraout_var;
  ostream *poVar11;
  _Base_ptr p_Var12;
  int64_t iVar13;
  ostringstream *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  undefined4 extraout_var_02;
  long *plVar14;
  size_type *psVar15;
  ulong uVar16;
  char *pcVar17;
  _func_int **pp_Var18;
  t_type *ptVar19;
  _Rb_tree_header *p_Var20;
  pointer pptVar21;
  bool bVar22;
  undefined1 auVar23 [12];
  ostringstream out;
  string local_220;
  t_lua_generator *local_200;
  string *local_1f8;
  string local_1f0;
  _Rb_tree_node_base *local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [376];
  
  this_00 = (ostringstream *)local_1a8;
  local_1f8 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream(this_00);
  ptVar10 = t_type::get_true_type(type);
  iVar7 = (*(ptVar10->super_t_doc)._vptr_t_doc[5])();
  if ((char)iVar7 == '\0') {
    iVar7 = (*(ptVar10->super_t_doc)._vptr_t_doc[10])();
    if ((char)iVar7 == '\0') {
      iVar7 = (*(ptVar10->super_t_doc)._vptr_t_doc[0xb])();
      local_200 = this;
      if (((char)iVar7 == '\0') &&
         (iVar7 = (*(ptVar10->super_t_doc)._vptr_t_doc[0xc])(), (char)iVar7 == '\0')) {
        iVar7 = (*(ptVar10->super_t_doc)._vptr_t_doc[0x10])();
        pp_Var18 = (ptVar10->super_t_doc)._vptr_t_doc;
        if ((char)iVar7 == '\0') {
          iVar7 = (*pp_Var18[0xe])();
          if (((char)iVar7 != '\0') ||
             (iVar7 = (*(ptVar10->super_t_doc)._vptr_t_doc[0xf])(), (char)iVar7 != '\0')) {
            (*(ptVar10->super_t_doc)._vptr_t_doc[0xe])();
            ptVar19 = *(t_type **)&ptVar10[1].super_t_doc.has_doc_;
            iVar7 = (*(ptVar10->super_t_doc)._vptr_t_doc[3])();
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,*(char **)CONCAT44(extraout_var_01,iVar7),
                                 ((undefined8 *)CONCAT44(extraout_var_01,iVar7))[1]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," = {",4);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
            pptVar21 = (value->listVal_).
                       super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl
                       .super__Vector_impl_data._M_start;
            if (pptVar21 !=
                (value->listVal_).
                super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              do {
                t_generator::indent((t_generator *)local_200,(ostream *)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
                render_const_value_abi_cxx11_(&local_220,local_200,ptVar19,*pptVar21);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1a8,local_220._M_dataplus._M_p,
                                     local_220._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,"]",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_220._M_dataplus._M_p != &local_220.field_2) {
                  operator_delete(local_220._M_dataplus._M_p);
                }
                uVar9 = (*(ptVar10->super_t_doc)._vptr_t_doc[0xf])();
                pcVar17 = " = false";
                if ((char)uVar9 != '\0') {
                  pcVar17 = " = true";
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,pcVar17,8 - (ulong)(uVar9 & 0xff));
                pptVar21 = pptVar21 + 1;
                if (pptVar21 ==
                    (value->listVal_).
                    super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
                    super__Vector_impl_data._M_finish) break;
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,::endl_abi_cxx11_._M_dataplus._M_p,
                           ::endl_abi_cxx11_._M_string_length);
              } while (pptVar21 !=
                       (value->listVal_).
                       super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl
                       .super__Vector_impl_data._M_finish);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}",1);
          }
        }
        else {
          iVar7 = (*pp_Var18[3])();
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,*(char **)CONCAT44(extraout_var_00,iVar7),
                               ((undefined8 *)CONCAT44(extraout_var_00,iVar7))[1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"{",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + 1;
          ptVar19 = *(t_type **)&ptVar10[1].super_t_doc.has_doc_;
          ptVar10 = *(t_type **)&ptVar10[1].annotations_._M_t._M_impl;
          p_Var12 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var20 = &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
          while ((_Rb_tree_header *)p_Var12 != p_Var20) {
            poVar11 = t_generator::indent((t_generator *)local_200,(ostream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"[",1);
            render_const_value_abi_cxx11_
                      (&local_220,local_200,ptVar19,*(t_const_value **)(p_Var12 + 1));
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,local_220._M_dataplus._M_p,local_220._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"] = ",4);
            render_const_value_abi_cxx11_
                      (&local_1f0,local_200,ptVar10,(t_const_value *)p_Var12[1]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_dataplus._M_p != &local_220.field_2) {
              operator_delete(local_220._M_dataplus._M_p);
            }
            p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
            if ((_Rb_tree_header *)p_Var12 != p_Var20) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,::endl_abi_cxx11_._M_dataplus._M_p,
                       ::endl_abi_cxx11_._M_string_length);
          }
          piVar1 = &(local_200->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + -1;
          poVar11 = t_generator::indent((t_generator *)local_200,(ostream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"}",1);
        }
      }
      else {
        iVar7 = (*(ptVar10->super_t_doc)._vptr_t_doc[3])();
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,*(char **)CONCAT44(extraout_var,iVar7),
                             ((undefined8 *)CONCAT44(extraout_var,iVar7))[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," = {",4);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
        p_Var12 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_1d0 = &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header;
        if (p_Var12 != local_1d0) {
          paVar2 = &local_220.field_2;
          while (pp_Var18 = ptVar10[1].super_t_doc._vptr_t_doc,
                pp_Var18 != (_func_int **)ptVar10[1].super_t_doc.doc_._M_dataplus._M_p) {
            ptVar19 = (t_type *)0x0;
            do {
              p_Var3 = *pp_Var18;
              lVar4 = *(long *)(*(long *)(p_Var12 + 1) + 0x48);
              local_220._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_220,lVar4,*(long *)(*(long *)(p_Var12 + 1) + 0x50) + lVar4
                        );
              _Var6._M_p = local_220._M_dataplus._M_p;
              __n = *(size_t *)(p_Var3 + 0x70);
              if (__n == local_220._M_string_length) {
                if (__n == 0) {
                  bVar22 = true;
                }
                else {
                  iVar7 = bcmp(*(void **)(p_Var3 + 0x68),local_220._M_dataplus._M_p,__n);
                  bVar22 = iVar7 == 0;
                }
              }
              else {
                bVar22 = false;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p != paVar2) {
                operator_delete(_Var6._M_p);
              }
              this = local_200;
              if (bVar22) {
                ptVar19 = *(t_type **)(*pp_Var18 + 0x60);
              }
              pp_Var18 = pp_Var18 + 1;
            } while (pp_Var18 != (_func_int **)ptVar10[1].super_t_doc.doc_._M_dataplus._M_p);
            if (ptVar19 == (t_type *)0x0) break;
            t_generator::indent((t_generator *)local_200,(ostream *)local_1a8);
            render_const_value_abi_cxx11_
                      (&local_220,this,g_type_string,*(t_const_value **)(p_Var12 + 1));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_dataplus._M_p != paVar2) {
              operator_delete(local_220._M_dataplus._M_p);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
            render_const_value_abi_cxx11_
                      (&local_220,this,ptVar19,(t_const_value *)p_Var12[1]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_dataplus._M_p != paVar2) {
              operator_delete(local_220._M_dataplus._M_p);
            }
            p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
            if (p_Var12 == local_1d0) goto LAB_002ab2fa;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
          }
          __return_storage_ptr___00 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x20);
          iVar7 = (*(ptVar10->super_t_doc)._vptr_t_doc[3])();
          std::operator+(&local_1f0,"type error: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(extraout_var_02,iVar7));
          plVar14 = (long *)std::__cxx11::string::append((char *)&local_1f0);
          local_220._M_dataplus._M_p = (pointer)*plVar14;
          psVar15 = (size_type *)(plVar14 + 2);
          if ((size_type *)local_220._M_dataplus._M_p == psVar15) {
            local_220.field_2._M_allocated_capacity = *psVar15;
            local_220.field_2._8_4_ = (undefined4)plVar14[3];
            local_220.field_2._12_4_ = *(undefined4 *)((long)plVar14 + 0x1c);
            local_220._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_220.field_2._M_allocated_capacity = *psVar15;
          }
          local_220._M_string_length = plVar14[1];
          *plVar14 = (long)psVar15;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
          lVar4 = *(long *)(*(long *)(p_Var12 + 1) + 0x48);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1c8,lVar4,*(long *)(*(long *)(p_Var12 + 1) + 0x50) + lVar4);
          std::operator+(__return_storage_ptr___00,&local_220,&local_1c8);
          __cxa_throw(__return_storage_ptr___00,&std::__cxx11::string::typeinfo,
                      std::__cxx11::string::~string);
        }
LAB_002ab2fa:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}",1);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + -1;
      }
    }
    else {
      t_const_value::get_integer(value);
      std::ostream::_M_insert<long>((long)local_1a8);
    }
    goto LAB_002ab774;
  }
  uVar9 = *(uint *)&ptVar10[1].super_t_doc._vptr_t_doc;
  switch(uVar9) {
  case 1:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\'",1);
    pcVar5 = (value->stringVal_)._M_dataplus._M_p;
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_220,pcVar5,pcVar5 + (value->stringVal_)._M_string_length);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\'",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p);
    }
    goto LAB_002ab774;
  case 2:
    iVar13 = t_const_value::get_integer(value);
    pcVar17 = "false";
    if (0 < iVar13) {
      pcVar17 = "true";
    }
    uVar16 = (ulong)(0 < iVar13) ^ 5;
    break;
  case 3:
  case 4:
  case 5:
    goto switchD_002ab0a9_caseD_3;
  case 6:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"lualongnumber.new(\'",0x13);
    t_const_value::get_integer(value);
    this_00 = (ostringstream *)std::ostream::_M_insert<long>((long)local_1a8);
    uVar16 = 2;
    pcVar17 = "\')";
    break;
  case 7:
    tVar8 = t_const_value::get_type(value);
    if (tVar8 != CV_INTEGER) {
      std::ostream::_M_insert<double>(value->doubleVal_);
      goto LAB_002ab774;
    }
    goto switchD_002ab0a9_caseD_3;
  default:
    auVar23 = __cxa_allocate_exception(0x20);
    t_base_type::t_base_name_abi_cxx11_(&local_220,(t_base_type *)(ulong)uVar9,auVar23._8_4_);
    std::operator+(auVar23._0_8_,"compiler error: no const of base type ",&local_220);
    __cxa_throw(auVar23._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar17,uVar16);
LAB_002ab774:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return local_1f8;
switchD_002ab0a9_caseD_3:
  t_const_value::get_integer(value);
  std::ostream::_M_insert<long>((long)local_1a8);
  goto LAB_002ab774;
}

Assistant:

string t_lua_generator::render_const_value(t_type* type, t_const_value* value) {
  std::ostringstream out;

  type = get_true_type(type);
  if (type->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_STRING:
      out << "'" << value->get_string() << "'";
      break;
    case t_base_type::TYPE_BOOL:
      out << (value->get_integer() > 0 ? "true" : "false");
      break;
    case t_base_type::TYPE_I8:
    case t_base_type::TYPE_I16:
    case t_base_type::TYPE_I32:
      out << value->get_integer();
      break;
    case t_base_type::TYPE_I64:
      out << "lualongnumber.new('" << value->get_integer() << "')";
      break;
    case t_base_type::TYPE_DOUBLE:
      if (value->get_type() == t_const_value::CV_INTEGER) {
        out << value->get_integer();
      } else {
        out << value->get_double();
      }
      break;
    default:
      throw "compiler error: no const of base type " + t_base_type::t_base_name(tbase);
    }
  } else if (type->is_enum()) {
    out << value->get_integer();
  } else if (type->is_struct() || type->is_xception()) {
    out << type->get_name() << " = {" << endl;
    indent_up();

    const vector<t_field*>& fields = ((t_struct*)type)->get_members();
    vector<t_field*>::const_iterator f_iter;
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end();) {
      t_type* field_type = nullptr;
      for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
        if ((*f_iter)->get_name() == v_iter->first->get_string()) {
          field_type = (*f_iter)->get_type();
        }
      }
      if (field_type == nullptr) {
        throw "type error: " + type->get_name() + " has no field " + v_iter->first->get_string();
      }

      indent(out);
      out << render_const_value(g_type_string, v_iter->first);
      out << " = ";
      out << render_const_value(field_type, v_iter->second);
      ++v_iter;
      if (v_iter != val.end()) {
        out << ",";
      }
    }

    out << "}";
    indent_down();
  } else if (type->is_map()) {
    out << type->get_name() << "{" << endl;
    indent_up();

    t_type* ktype = ((t_map*)type)->get_key_type();
    t_type* vtype = ((t_map*)type)->get_val_type();

    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end();) {
      indent(out) << "[" << render_const_value(ktype, v_iter->first)
                  << "] = " << render_const_value(vtype, v_iter->second);
      ++v_iter;
      if (v_iter != val.end()) {
        out << ",";
      }
      out << endl;
    }
    indent_down();
    indent(out) << "}";
  } else if (type->is_list() || type->is_set()) {
    t_type* etype;
    if (type->is_list()) {
      etype = ((t_list*)type)->get_elem_type();
    } else {
      etype = ((t_set*)type)->get_elem_type();
    }
    out << type->get_name() << " = {" << endl;
    const vector<t_const_value*>& val = value->get_list();
    vector<t_const_value*>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end();) {
      indent(out);
      out << "[" << render_const_value(etype, *v_iter) << "]";
      if (type->is_set()) {
        out << " = true";
      } else {
        out << " = false";
      }
      ++v_iter;
      if (v_iter != val.end()) {
        out << "," << endl;
      }
    }
    out << "}";
  }
  return out.str();
}